

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::EmitSyncMarker
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  TracePacket *pTVar1;
  size_t sVar2;
  reference this_00;
  undefined1 local_a8 [8];
  StaticBuffered<perfetto::protos::pbzero::TracePacket> packet;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets_local;
  TracingServiceImpl *this_local;
  
  packet.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = (size_t)packets;
  if (this->sync_marker_packet_size_ == 0) {
    protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::StaticBuffered
              ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8,
               this->sync_marker_packet_,0x20);
    pTVar1 = protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8);
    protos::pbzero::TracePacket::set_trusted_uid(pTVar1,this->uid_);
    pTVar1 = protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8);
    protos::pbzero::TracePacket::set_trusted_packet_sequence_id(pTVar1,1);
    pTVar1 = protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8);
    protos::pbzero::TracePacket::set_synchronization_marker(pTVar1,kSyncMarker,0x10);
    sVar2 = protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::Finalize
                      ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8);
    this->sync_marker_packet_size_ = sVar2;
    protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::~StaticBuffered
              ((StaticBuffered<perfetto::protos::pbzero::TracePacket> *)local_a8);
  }
  std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::emplace_back<>
            ((vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
             packet.msg_.root_arena_.blocks_.
             super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
             ._M_impl._M_node._M_size);
  this_00 = std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::back
                      ((vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
                       packet.msg_.root_arena_.blocks_.
                       super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
                       ._M_impl._M_node._M_size);
  TracePacket::AddSlice(this_00,this->sync_marker_packet_,this->sync_marker_packet_size_);
  return;
}

Assistant:

void TracingServiceImpl::EmitSyncMarker(std::vector<TracePacket>* packets) {
  // The sync marks are used to tokenize large traces efficiently.
  // See description in trace_packet.proto.
  if (sync_marker_packet_size_ == 0) {
    // The marker ABI expects that the marker is written after the uid.
    // Protozero guarantees that fields are written in the same order of the
    // calls. The ResynchronizeTraceStreamUsingSyncMarker test verifies the ABI.
    protozero::StaticBuffered<protos::pbzero::TracePacket> packet(
        &sync_marker_packet_[0], sizeof(sync_marker_packet_));
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);

    // Keep this last.
    packet->set_synchronization_marker(kSyncMarker, sizeof(kSyncMarker));
    sync_marker_packet_size_ = packet.Finalize();
  }
  packets->emplace_back();
  packets->back().AddSlice(&sync_marker_packet_[0], sync_marker_packet_size_);
}